

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcResub.c
# Opt level: O0

void Abc_ManResubDivsD(Abc_ManRes_t *p,int Required)

{
  void *pvVar1;
  void *pvVar2;
  void *pvVar3;
  Vec_Ptr_t *pVVar4;
  int iVar5;
  Abc_Obj_t *p_00;
  Abc_Obj_t *pAVar6;
  Abc_Obj_t *pAVar7;
  int local_4c;
  int local_48;
  int w;
  int k;
  int i;
  uint *puDataR;
  uint *puData1;
  uint *puData0;
  Abc_Obj_t *pObj1;
  Abc_Obj_t *pObj0;
  int Required_local;
  Abc_ManRes_t *p_local;
  
  Vec_PtrClear(p->vDivs2UP0);
  Vec_PtrClear(p->vDivs2UP1);
  Vec_PtrClear(p->vDivs2UN0);
  Vec_PtrClear(p->vDivs2UN1);
  pvVar1 = (p->pRoot->field_5).pData;
  for (w = 0; iVar5 = Vec_PtrSize(p->vDivs1B), w < iVar5; w = w + 1) {
    p_00 = (Abc_Obj_t *)Vec_PtrEntry(p->vDivs1B,w);
    if ((int)(*(uint *)&p_00->field_0x14 >> 0xc) <= Required + -2) {
      pvVar2 = (p_00->field_5).pData;
      local_48 = w;
      while( true ) {
        local_48 = local_48 + 1;
        iVar5 = Vec_PtrSize(p->vDivs1B);
        if (iVar5 <= local_48) break;
        pAVar6 = (Abc_Obj_t *)Vec_PtrEntry(p->vDivs1B,local_48);
        if ((int)(*(uint *)&pAVar6->field_0x14 >> 0xc) <= Required + -2) {
          pvVar3 = (pAVar6->field_5).pData;
          iVar5 = Vec_PtrSize(p->vDivs2UP0);
          if (iVar5 < 500) {
            local_4c = 0;
            while ((local_4c < p->nWords &&
                   ((*(uint *)((long)pvVar2 + (long)local_4c * 4) &
                     *(uint *)((long)pvVar3 + (long)local_4c * 4) &
                     (*(uint *)((long)pvVar1 + (long)local_4c * 4) ^ 0xffffffff) &
                    p->pCareSet[local_4c]) == 0))) {
              local_4c = local_4c + 1;
            }
            if (local_4c == p->nWords) {
              Vec_PtrPush(p->vDivs2UP0,p_00);
              Vec_PtrPush(p->vDivs2UP1,pAVar6);
            }
            local_4c = 0;
            while ((local_4c < p->nWords &&
                   (((*(uint *)((long)pvVar2 + (long)local_4c * 4) ^ 0xffffffff) &
                     *(uint *)((long)pvVar3 + (long)local_4c * 4) &
                     (*(uint *)((long)pvVar1 + (long)local_4c * 4) ^ 0xffffffff) &
                    p->pCareSet[local_4c]) == 0))) {
              local_4c = local_4c + 1;
            }
            if (local_4c == p->nWords) {
              pVVar4 = p->vDivs2UP0;
              pAVar7 = Abc_ObjNot(p_00);
              Vec_PtrPush(pVVar4,pAVar7);
              Vec_PtrPush(p->vDivs2UP1,pAVar6);
            }
            local_4c = 0;
            while ((local_4c < p->nWords &&
                   ((*(uint *)((long)pvVar2 + (long)local_4c * 4) &
                     (*(uint *)((long)pvVar3 + (long)local_4c * 4) ^ 0xffffffff) &
                     (*(uint *)((long)pvVar1 + (long)local_4c * 4) ^ 0xffffffff) &
                    p->pCareSet[local_4c]) == 0))) {
              local_4c = local_4c + 1;
            }
            if (local_4c == p->nWords) {
              Vec_PtrPush(p->vDivs2UP0,p_00);
              pVVar4 = p->vDivs2UP1;
              pAVar7 = Abc_ObjNot(pAVar6);
              Vec_PtrPush(pVVar4,pAVar7);
            }
            local_4c = 0;
            while ((local_4c < p->nWords &&
                   (((*(uint *)((long)pvVar2 + (long)local_4c * 4) |
                     *(uint *)((long)pvVar3 + (long)local_4c * 4)) &
                     (*(uint *)((long)pvVar1 + (long)local_4c * 4) ^ 0xffffffff) &
                    p->pCareSet[local_4c]) == 0))) {
              local_4c = local_4c + 1;
            }
            if (local_4c == p->nWords) {
              pVVar4 = p->vDivs2UP0;
              pAVar7 = Abc_ObjNot(p_00);
              Vec_PtrPush(pVVar4,pAVar7);
              pVVar4 = p->vDivs2UP1;
              pAVar7 = Abc_ObjNot(pAVar6);
              Vec_PtrPush(pVVar4,pAVar7);
            }
          }
          iVar5 = Vec_PtrSize(p->vDivs2UN0);
          if (iVar5 < 500) {
            local_4c = 0;
            while ((local_4c < p->nWords &&
                   (((*(uint *)((long)pvVar2 + (long)local_4c * 4) &
                      *(uint *)((long)pvVar3 + (long)local_4c * 4) ^ 0xffffffff) &
                     *(uint *)((long)pvVar1 + (long)local_4c * 4) & p->pCareSet[local_4c]) == 0))) {
              local_4c = local_4c + 1;
            }
            if (local_4c == p->nWords) {
              Vec_PtrPush(p->vDivs2UN0,p_00);
              Vec_PtrPush(p->vDivs2UN1,pAVar6);
            }
            local_4c = 0;
            while ((local_4c < p->nWords &&
                   ((((*(uint *)((long)pvVar2 + (long)local_4c * 4) ^ 0xffffffff) &
                      *(uint *)((long)pvVar3 + (long)local_4c * 4) ^ 0xffffffff) &
                     *(uint *)((long)pvVar1 + (long)local_4c * 4) & p->pCareSet[local_4c]) == 0))) {
              local_4c = local_4c + 1;
            }
            if (local_4c == p->nWords) {
              pVVar4 = p->vDivs2UN0;
              pAVar7 = Abc_ObjNot(p_00);
              Vec_PtrPush(pVVar4,pAVar7);
              Vec_PtrPush(p->vDivs2UN1,pAVar6);
            }
            local_4c = 0;
            while ((local_4c < p->nWords &&
                   (((*(uint *)((long)pvVar2 + (long)local_4c * 4) &
                      (*(uint *)((long)pvVar3 + (long)local_4c * 4) ^ 0xffffffff) ^ 0xffffffff) &
                     *(uint *)((long)pvVar1 + (long)local_4c * 4) & p->pCareSet[local_4c]) == 0))) {
              local_4c = local_4c + 1;
            }
            if (local_4c == p->nWords) {
              Vec_PtrPush(p->vDivs2UN0,p_00);
              pVVar4 = p->vDivs2UN1;
              pAVar7 = Abc_ObjNot(pAVar6);
              Vec_PtrPush(pVVar4,pAVar7);
            }
            local_4c = 0;
            while ((local_4c < p->nWords &&
                   ((((*(uint *)((long)pvVar2 + (long)local_4c * 4) |
                      *(uint *)((long)pvVar3 + (long)local_4c * 4)) ^ 0xffffffff) &
                     *(uint *)((long)pvVar1 + (long)local_4c * 4) & p->pCareSet[local_4c]) == 0))) {
              local_4c = local_4c + 1;
            }
            if (local_4c == p->nWords) {
              pVVar4 = p->vDivs2UN0;
              pAVar7 = Abc_ObjNot(p_00);
              Vec_PtrPush(pVVar4,pAVar7);
              pVVar4 = p->vDivs2UN1;
              pAVar6 = Abc_ObjNot(pAVar6);
              Vec_PtrPush(pVVar4,pAVar6);
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void Abc_ManResubDivsD( Abc_ManRes_t * p, int Required )
{
    Abc_Obj_t * pObj0, * pObj1;
    unsigned * puData0, * puData1, * puDataR;
    int i, k, w;
    Vec_PtrClear( p->vDivs2UP0 );
    Vec_PtrClear( p->vDivs2UP1 );
    Vec_PtrClear( p->vDivs2UN0 );
    Vec_PtrClear( p->vDivs2UN1 );
    puDataR = (unsigned *)p->pRoot->pData;
    Vec_PtrForEachEntry( Abc_Obj_t *, p->vDivs1B, pObj0, i )
    {
        if ( (int)pObj0->Level > Required - 2 )
            continue;

        puData0 = (unsigned *)pObj0->pData;
        Vec_PtrForEachEntryStart( Abc_Obj_t *, p->vDivs1B, pObj1, k, i + 1 )
        {
            if ( (int)pObj1->Level > Required - 2 )
                continue;

            puData1 = (unsigned *)pObj1->pData;

            if ( Vec_PtrSize(p->vDivs2UP0) < ABC_RS_DIV2_MAX )
            {
                // get positive unate divisors
                for ( w = 0; w < p->nWords; w++ )
//                    if ( (puData0[w] & puData1[w]) & ~puDataR[w] )
                    if ( (puData0[w] & puData1[w]) & ~puDataR[w] & p->pCareSet[w] ) // care set
                        break;
                if ( w == p->nWords )
                {
                    Vec_PtrPush( p->vDivs2UP0, pObj0 );
                    Vec_PtrPush( p->vDivs2UP1, pObj1 );
                }
                for ( w = 0; w < p->nWords; w++ )
//                    if ( (~puData0[w] & puData1[w]) & ~puDataR[w] )
                    if ( (~puData0[w] & puData1[w]) & ~puDataR[w] & p->pCareSet[w] ) // care set
                        break;
                if ( w == p->nWords )
                {
                    Vec_PtrPush( p->vDivs2UP0, Abc_ObjNot(pObj0) );
                    Vec_PtrPush( p->vDivs2UP1, pObj1 );
                }
                for ( w = 0; w < p->nWords; w++ )
//                    if ( (puData0[w] & ~puData1[w]) & ~puDataR[w] )
                    if ( (puData0[w] & ~puData1[w]) & ~puDataR[w] & p->pCareSet[w] ) // care set
                        break;
                if ( w == p->nWords )
                {
                    Vec_PtrPush( p->vDivs2UP0, pObj0 );
                    Vec_PtrPush( p->vDivs2UP1, Abc_ObjNot(pObj1) );
                }
                for ( w = 0; w < p->nWords; w++ )
//                    if ( (puData0[w] | puData1[w]) & ~puDataR[w] )
                    if ( (puData0[w] | puData1[w]) & ~puDataR[w] & p->pCareSet[w] ) // care set
                        break;
                if ( w == p->nWords )
                {
                    Vec_PtrPush( p->vDivs2UP0, Abc_ObjNot(pObj0) );
                    Vec_PtrPush( p->vDivs2UP1, Abc_ObjNot(pObj1) );
                }
            }

            if ( Vec_PtrSize(p->vDivs2UN0) < ABC_RS_DIV2_MAX )
            {
                // get negative unate divisors
                for ( w = 0; w < p->nWords; w++ )
//                    if ( ~(puData0[w] & puData1[w]) & puDataR[w] )
                    if ( ~(puData0[w] & puData1[w]) & puDataR[w] & p->pCareSet[w] ) // care set
                        break;
                if ( w == p->nWords )
                {
                    Vec_PtrPush( p->vDivs2UN0, pObj0 );
                    Vec_PtrPush( p->vDivs2UN1, pObj1 );
                }
                for ( w = 0; w < p->nWords; w++ )
//                    if ( ~(~puData0[w] & puData1[w]) & puDataR[w] )
                    if ( ~(~puData0[w] & puData1[w]) & puDataR[w] & p->pCareSet[w] ) // care set
                        break;
                if ( w == p->nWords )
                {
                    Vec_PtrPush( p->vDivs2UN0, Abc_ObjNot(pObj0) );
                    Vec_PtrPush( p->vDivs2UN1, pObj1 );
                }
                for ( w = 0; w < p->nWords; w++ )
//                    if ( ~(puData0[w] & ~puData1[w]) & puDataR[w] )
                    if ( ~(puData0[w] & ~puData1[w]) & puDataR[w] & p->pCareSet[w] ) // care set
                        break;
                if ( w == p->nWords )
                {
                    Vec_PtrPush( p->vDivs2UN0, pObj0 );
                    Vec_PtrPush( p->vDivs2UN1, Abc_ObjNot(pObj1) );
                }
                for ( w = 0; w < p->nWords; w++ )
//                    if ( ~(puData0[w] | puData1[w]) & puDataR[w] )
                    if ( ~(puData0[w] | puData1[w]) & puDataR[w] & p->pCareSet[w] ) // care set
                        break;
                if ( w == p->nWords )
                {
                    Vec_PtrPush( p->vDivs2UN0, Abc_ObjNot(pObj0) );
                    Vec_PtrPush( p->vDivs2UN1, Abc_ObjNot(pObj1) );
                }
            }
        }
    }
//    printf( "%d %d  ", Vec_PtrSize(p->vDivs2UP0), Vec_PtrSize(p->vDivs2UN0) );
}